

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O2

void __thiscall
duckdb::FixedBatchCopyGlobalState::FixedBatchCopyGlobalState
          (FixedBatchCopyGlobalState *this,ClientContext *context_p,idx_t minimum_memory_per_thread)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
           super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__FixedBatchCopyGlobalState_027bd7d0;
  BatchMemoryManager::BatchMemoryManager(&this->memory_manager,context_p,minimum_memory_per_thread);
  BatchTaskManager<duckdb::BatchCopyTask>::BatchTaskManager(&this->task_manager);
  (this->raw_batches)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->raw_batches)._M_t._M_impl.super__Rb_tree_header;
  (this->raw_batches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->flush_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->flush_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->flush_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->flush_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->flush_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->initialized)._M_base._M_i = false;
  (this->rows_copied).super___atomic_base<unsigned_long>._M_i = 0;
  (this->global_state).
  super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
  .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl =
       (GlobalFunctionData *)0x0;
  this->batch_size = 0;
  (this->raw_batches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->raw_batches)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->raw_batches)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->batch_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->batch_data)._M_t._M_impl.super__Rb_tree_header;
  (this->batch_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->batch_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->batch_data)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  *(undefined8 *)((long)&(this->scheduled_batch_index).super___atomic_base<unsigned_long>._M_i + 2)
       = 0;
  *(undefined8 *)((long)&(this->flushed_batch_index).super___atomic_base<unsigned_long>._M_i + 2) =
       0;
  (this->batch_data)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->scheduled_batch_index).super___atomic_base<unsigned_long>._M_i = 0;
  this->minimum_memory_per_thread = minimum_memory_per_thread;
  (this->written_file_info).
  super_unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyToFileInfo_*,_std::default_delete<duckdb::CopyToFileInfo>_>.
  super__Head_base<0UL,_duckdb::CopyToFileInfo_*,_false>._M_head_impl = (CopyToFileInfo *)0x0;
  return;
}

Assistant:

explicit FixedBatchCopyGlobalState(ClientContext &context_p, idx_t minimum_memory_per_thread)
	    : memory_manager(context_p, minimum_memory_per_thread), initialized(false), rows_copied(0), batch_size(0),
	      scheduled_batch_index(0), flushed_batch_index(0), any_flushing(false), any_finished(false),
	      minimum_memory_per_thread(minimum_memory_per_thread) {
	}